

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Guild.cpp
# Opt level: O3

void Handlers::Guild_Buy(Character *character,PacketReader *reader)

{
  pointer pcVar1;
  World *pWVar2;
  uint amount;
  int iVar3;
  mapped_type *pmVar4;
  uint uVar5;
  PacketBuilder reply;
  undefined1 local_50 [48];
  
  if ((character->trading == false) && ((character->nointeract & 2) == 0)) {
    PacketReader::GetInt(reader);
    amount = PacketReader::GetInt(reader);
    if ((-1 < (int)amount) &&
       ((character->npc_type == Guild &&
        ((character->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0)))) {
      pWVar2 = character->world;
      pcVar1 = local_50 + 0x10;
      local_50._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"GuildBankMax","");
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar2->config,(key_type *)local_50);
      iVar3 = util::variant::GetInt(pmVar4);
      uVar5 = iVar3 - ((character->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->bank;
      if ((pointer)local_50._0_8_ != pcVar1) {
        operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
      }
      if (0 < (int)uVar5) {
        if (uVar5 < amount) {
          amount = uVar5;
        }
        pWVar2 = character->world;
        local_50._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"GuildMinDeposit","");
        pmVar4 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar2->config,(key_type *)local_50);
        iVar3 = util::variant::GetInt(pmVar4);
        if ((int)amount < iVar3) {
          if ((pointer)local_50._0_8_ != pcVar1) {
            operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
          }
        }
        else {
          iVar3 = Character::HasItem(character,1,false);
          if ((pointer)local_50._0_8_ != pcVar1) {
            operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
          }
          if ((int)amount <= iVar3) {
            Character::DelItem(character,1,amount);
            Guild::AddBank((character->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,amount);
            PacketBuilder::PacketBuilder((PacketBuilder *)local_50,PACKET_GUILD,PACKET_BUY,4);
            iVar3 = Character::HasItem(character,1,false);
            PacketBuilder::AddInt((PacketBuilder *)local_50,iVar3);
            Character::Send(character,(PacketBuilder *)local_50);
            PacketBuilder::~PacketBuilder((PacketBuilder *)local_50);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Guild_Buy(Character *character, PacketReader &reader)
{
	if (character->trading) return;
	if (!character->CanInteractItems()) return;

	/*int session = */reader.GetInt();
	int gold = reader.GetInt();

	if (gold < 0)
		return;

	if (character->npc_type == ENF::Guild)
	{
		if (character->guild)
		{
			int max_deposit = int(character->world->config["GuildBankMax"]) - character->guild->bank;

			if (max_deposit <= 0)
				return;

			gold = std::min(gold, max_deposit);

			if (gold >= static_cast<int>(character->world->config["GuildMinDeposit"]) && character->HasItem(1) >= gold)
			{
				character->DelItem(1, gold);
				character->guild->AddBank(gold);

				PacketBuilder reply(PACKET_GUILD, PACKET_BUY, 4);
				reply.AddInt(character->HasItem(1));
				character->Send(reply);
			}
		}
	}
}